

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O3

int qc_staticlist_get_at(QcStaticList *staticList,int cell)

{
  int iVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  QcStaticList *pQVar6;
  
  iVar3 = -1;
  if (((-1 < cell && staticList != (QcStaticList *)0x0) && (cell < staticList->limit)) &&
     (iVar3 = -99, staticList->head != -99)) {
    lVar2 = staticList->buff_offset;
    uVar4 = (ulong)(uint)cell;
    iVar3 = *(int *)((long)&staticList->head + uVar4 * 8 + lVar2);
    iVar1 = *(int *)((long)&staticList->tail + uVar4 * 8 + lVar2);
    pQVar6 = (QcStaticList *)((long)&staticList->tail + (long)iVar3 * 8 + lVar2);
    if ((long)iVar3 == -99) {
      pQVar6 = staticList;
    }
    pQVar6->head = iVar1;
    piVar5 = (int *)((long)&staticList->head + (long)iVar1 * 8 + lVar2);
    if ((long)iVar1 == -99) {
      piVar5 = &staticList->tail;
    }
    *piVar5 = iVar3;
    staticList->num = staticList->num + -1;
    *(undefined8 *)((long)&staticList->head + uVar4 * 8 + lVar2) = 0xffffff9dffffff9d;
    iVar3 = cell;
  }
  return iVar3;
}

Assistant:

int qc_staticlist_get_at(QcStaticList *staticList, int cell)
{
    int pre, next;
    _StaticCell *curCell, *preCell, *nextCell;

    if(NULL == staticList || cell<0 || cell>=staticList->limit)
        return -1;

    if(staticList->head == QC_INVALID_INT)
        return QC_INVALID_INT;

    curCell = get_staticlist_cell(staticList, cell);

    pre  = curCell->previous;
    next = curCell->next;
    
    if(pre != QC_INVALID_INT)
    {
        preCell = get_staticlist_cell(staticList, pre);
        preCell->next = next;
    }
    else
    {
        staticList->head = next;
    }

    if(next != QC_INVALID_INT)
    {
        nextCell = get_staticlist_cell(staticList, next);
        nextCell->previous = pre;
    }
    else
    {
        staticList->tail = pre;
    }

    staticList->num --;

    curCell->previous  = QC_INVALID_INT;
    curCell->next = QC_INVALID_INT;

    return cell;
}